

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

kp_error_t command(kp_ctx *ctx,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  kp_error_t kVar3;
  int *piVar4;
  char **in_RDX;
  int in_ESI;
  kp_ctx *in_RDI;
  kp_error_t ret;
  char *socket_path;
  kp_cmd *cmd;
  char *pcVar5;
  kp_cmd *local_28;
  
  pcVar5 = (char *)0x0;
  if (in_ESI <= _optind) {
    kp_errx(2,"missing command");
  }
  iVar1 = strncmp(in_RDX[_optind],"help",4);
  if (iVar1 == 0) {
    local_28 = &kp_cmd_help;
  }
  else {
    local_28 = find_command(pcVar5);
  }
  kp_init(in_RDI);
  if (local_28 != &kp_cmd_init) {
    uVar2 = kp_open(in_RDI);
    if ((uVar2 == 5) && (piVar4 = __errno_location(), *piVar4 == 2)) {
      kp_err(5,"No workspace, first run `%s init`",___progname);
    }
    else if (uVar2 != 0) {
      kp_err((kp_error_t)(ulong)uVar2,"An error occured while opening the workspace");
    }
  }
  pcVar5 = getenv("KP_AGENT_SOCK");
  if (pcVar5 != (char *)0x0) {
    uVar2 = kp_agent_init(&in_RDI->agent,pcVar5);
    if (uVar2 != 0) {
      kp_warn((kp_error_t)(ulong)uVar2,"cannot connect to agent socket %s",pcVar5);
      return uVar2;
    }
    uVar2 = kp_agent_connect(&in_RDI->agent);
    if (uVar2 != 0) {
      kp_warn((kp_error_t)(ulong)uVar2,"cannot connect to agent socket %s",pcVar5);
      return uVar2;
    }
  }
  _optind = _optind + 1;
  kVar3 = (*local_28->main)(in_RDI,in_ESI,in_RDX);
  return kVar3;
}

Assistant:

static kp_error_t
command(struct kp_ctx *ctx, int argc, char **argv)
{
	extern char *__progname;
	struct kp_cmd *cmd;
	char *socket_path = NULL;
	kp_error_t ret;

	if (optind >= argc)
		kp_errx(KP_EINPUT, "missing command");

	/* Test for help first so we don't mess with cmds */
	if (strncmp(argv[optind], "help", 4) == 0) {
		cmd = &kp_cmd_help;
	} else {
		cmd = find_command(argv[optind]);
	}

	ret = kp_init(ctx);
	if (cmd != &kp_cmd_init) {
		ret = kp_open(ctx);
		if (ret == KP_ERRNO && errno == ENOENT) {
			kp_err(ret, "No workspace, first run `%s init`",
			       __progname);
		} else if (ret != KP_SUCCESS) {
			kp_err(ret,
			       "An error occured while opening the workspace");
		}
	}

	/* Try to connect to agent */
	if ((socket_path = getenv(KP_AGENT_SOCKET_ENV)) != NULL) {
		if ((ret = kp_agent_init(&ctx->agent, socket_path))
		    != KP_SUCCESS) {
			kp_warn(ret, "cannot connect to agent socket %s",
			        socket_path);
			return ret;
		}

		if ((ret = kp_agent_connect(&ctx->agent)) != KP_SUCCESS) {
			kp_warn(ret, "cannot connect to agent socket %s",
			        socket_path);
			return ret;
		}
	}

	optind++;

	return cmd->main(ctx, argc, argv);
}